

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curry.hpp
# Opt level: O0

Curried<std::function<int_(Thing_*,_int,_int,_int)>_> *
lambda::curry<int,Thing,int,int,int>(offset_in_Thing_to_subr fn)

{
  Curried<std::function<int_(Thing_*,_int,_int,_int)>_> *in_RDI;
  function<int_(Thing_*,_int,_int,_int)> *in_stack_ffffffffffffff78;
  function<int_(Thing_*,_int,_int,_int)> local_48 [2];
  
  std::function<int(Thing*,int,int,int)>::
  function<lambda::curry<int,Thing,int,int,int>(int(Thing::*)(int,int,int))::_lambda(Thing*,int&&,int&&,int&&)_1_,void>
            (local_48,(anon_class_16_1_3fcf6586 *)in_RDI);
  Curried<std::function<int_(Thing_*,_int,_int,_int)>_>::Curried(in_RDI,in_stack_ffffffffffffff78);
  std::function<int_(Thing_*,_int,_int,_int)>::~function
            ((function<int_(Thing_*,_int,_int,_int)> *)0x18432d);
  return in_RDI;
}

Assistant:

auto curry(R (C::*fn)(Args...)) {
    return Curried<std::function<R(C *, Args...)>>(
        [fn](C *c, Args &&... ps) { return (c->*fn)(std::forward<decltype(ps)>(ps)...); });
}